

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  float fVar2;
  undefined8 uVar3;
  byte bVar4;
  ulong *puVar5;
  undefined4 uVar6;
  char cVar7;
  int iVar8;
  istream *piVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  long *plVar12;
  ulong uVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vec3f point;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  float *local_8c8;
  int padding;
  float dx;
  undefined1 local_8b8 [8];
  float fStack_8b0;
  undefined4 uStack_8ac;
  string outname;
  Vec<3U,_float> local_888;
  ulong local_878;
  ios_base *local_870;
  int v1;
  size_type local_860;
  ulong local_858 [2];
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> faceList;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> vertList;
  Vec3ui sizes;
  int v2;
  undefined4 uStack_7f4;
  long local_7f0;
  ulong local_7e8 [2];
  int *local_7d8;
  undefined1 (*local_7d0) [16];
  string line;
  string filename;
  ofstream outfile;
  float fStack_784;
  size_t sStack_780;
  long local_778;
  undefined8 uStack_770;
  ios_base local_708 [120];
  ios_base local_690 [264];
  undefined1 local_588 [32];
  undefined1 local_568 [32];
  ifstream infile;
  size_t local_540;
  long local_538 [2];
  byte abStack_528 [488];
  stringstream arg3;
  ios_base aiStack_2c0 [264];
  stringstream arg2;
  ios_base aiStack_138 [264];
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[1],(allocator<char> *)&infile);
    if (4 < filename._M_string_length) {
      std::__cxx11::string::substr((ulong)&infile,(ulong)&filename);
      _outfile = &local_778;
      std::__cxx11::string::_M_construct<char_const*>((string *)&outfile,".obj","");
      plVar12 = _outfile;
      if (local_540 == sStack_780) {
        if (local_540 == 0) {
          bVar14 = false;
        }
        else {
          iVar8 = bcmp(_infile,_outfile,local_540);
          bVar14 = iVar8 != 0;
        }
      }
      else {
        bVar14 = true;
      }
      if (plVar12 != &local_778) {
        operator_delete(plVar12,local_778 + 1);
      }
      if (_infile != local_538) {
        operator_delete(_infile,local_538[0] + 1);
      }
      if (!bVar14) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&infile,argv[2],(allocator<char> *)&outfile);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&arg2,(string *)&infile,_S_out|_S_in);
        if (_infile != local_538) {
          operator_delete(_infile,local_538[0] + 1);
        }
        std::istream::_M_extract<float>((float *)&arg2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&infile,argv[3],(allocator<char> *)&outfile);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&arg3,(string *)&infile,_S_out|_S_in);
        if (_infile != local_538) {
          operator_delete(_infile,local_538[0] + 1);
        }
        std::istream::operator>>((istream *)&arg3,&padding);
        if (padding < 1) {
          padding = 1;
        }
        auVar26._8_4_ = 0x7f7fffff;
        auVar26._0_8_ = 0x7f7fffff7f7fffff;
        auVar26._12_4_ = 0x7f7fffff;
        local_8b8 = (undefined1  [8])vmovlps_avx(auVar26);
        fStack_8b0 = 3.4028235e+38;
        local_888.v[0] = -3.4028235e+38;
        local_888.v[1] = -3.4028235e+38;
        local_888.v[2] = -3.4028235e+38;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Reading data.\n",0xe);
        std::ifstream::ifstream(&infile,argv[1],_S_in);
        if ((abStack_528[_infile[-3]] & 5) != 0) {
          std::operator<<((ostream *)&std::cerr,"Failed to open. Terminating.\n");
          goto LAB_001046d1;
        }
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_878 = 0;
        faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        faceList.super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar1 = _infile[-3];
        if ((abStack_528[lVar1] & 2) == 0) {
          local_870 = local_708;
          auVar27 = vpbroadcastq_avx512vl();
          auVar28 = vpmovsxbq_avx2(ZEXT416(0xc080400));
          local_568 = vpaddq_avx2(auVar27,auVar28);
          local_7d0 = local_568._0_8_;
          auVar27 = vpbroadcastq_avx512vl();
          local_588 = vpaddq_avx2(auVar27,auVar28);
          local_7d8 = local_588._0_8_;
          local_878 = 0;
          do {
            cVar7 = std::ios::widen((char)&point + (char)lVar1 + -0x60);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&infile,(string *)&line,cVar7);
            std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
            point.v._0_8_ = local_8d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&point,"v","");
            if (sStack_780 == CONCAT44(uStack_8dc,point.v[2])) {
              if (sStack_780 != 0) {
                iVar8 = bcmp(_outfile,(void *)point.v._0_8_,sStack_780);
                if (iVar8 != 0) goto LAB_00103854;
              }
              std::__cxx11::string::substr((ulong)&outname,(ulong)&line);
              _v1 = local_858;
              std::__cxx11::string::_M_construct<char_const*>((string *)&v1,"vn","");
              puVar5 = _v1;
              if (outname._M_string_length == local_860) {
                if (outname._M_string_length == 0) {
                  bVar14 = false;
                }
                else {
                  iVar8 = bcmp(outname._M_dataplus._M_p,_v1,outname._M_string_length);
                  bVar14 = iVar8 != 0;
                }
              }
              else {
                bVar14 = true;
              }
              if (puVar5 != local_858) {
                operator_delete(puVar5,local_858[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)outname._M_dataplus._M_p != &outname.field_2) {
                operator_delete(outname._M_dataplus._M_p,
                                CONCAT71(outname.field_2._M_allocated_capacity._1_7_,
                                         outname.field_2._M_local_buf[0]) + 1);
              }
            }
            else {
LAB_00103854:
              bVar14 = false;
            }
            if ((undefined1 *)point.v._0_8_ != local_8d8) {
              operator_delete((void *)point.v._0_8_,local_8d8._0_8_ + 1);
            }
            if (_outfile != &local_778) {
              operator_delete(_outfile,local_778 + 1);
            }
            if (bVar14) {
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
              piVar9 = std::operator>>((istream *)&outfile,(char *)&outname);
              piVar9 = std::istream::_M_extract<float>((float *)piVar9);
              piVar9 = std::istream::_M_extract<float>((float *)piVar9);
              std::istream::_M_extract<float>((float *)piVar9);
              if (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Vec<3u,float>,std::allocator<Vec<3u,float>>>::
                _M_realloc_insert<Vec<3u,float>const&>
                          ((vector<Vec<3u,float>,std::allocator<Vec<3u,float>>> *)&vertList,
                           (iterator)
                           vertList.
                           super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&point);
              }
              else {
                (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->v[2] = point.v[2];
                *(undefined8 *)
                 (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->v = point.v._0_8_;
                vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              auVar17._8_4_ = point.v[2];
              auVar17._0_4_ = point.v[0];
              auVar17._4_4_ = point.v[1];
              auVar17._12_4_ = 0;
              auVar18._0_12_ = SUB1612(*local_7d0,0);
              auVar18._12_4_ = 0;
              uVar3 = vcmpps_avx512vl(auVar17,auVar18,1);
              bVar15 = ~(byte)uVar3;
              bVar4 = bVar15 & 7;
              auVar19._4_4_ = (uint)(bVar4 >> 1 & 1) * local_7d8[1];
              auVar19._0_4_ = (uint)(bVar15 & 1) * *local_7d8;
              auVar19._8_4_ = (uint)(bVar4 >> 2) * local_7d8[2];
              auVar19._12_4_ = 0;
              uVar16 = vcmpps_avx512vl(auVar19,auVar17,1);
              uVar16 = bVar4 & uVar16;
              auVar28 = vpblendmq_avx512vl(local_568,local_588);
              bVar14 = (bool)((byte)uVar16 & 1);
              auVar27._0_8_ = (ulong)bVar14 * auVar28._0_8_ | (ulong)!bVar14 * local_568._0_8_;
              bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
              auVar27._8_8_ = (ulong)bVar14 * auVar28._8_8_ | (ulong)!bVar14 * local_568._8_8_;
              auVar27._16_8_ =
                   (uVar16 >> 2) * auVar28._16_8_ | (ulong)!SUB81(uVar16 >> 2,0) * local_568._16_8_;
              auVar27._24_8_ = local_568._24_8_;
              vscatterqps_avx512vl
                        (ZEXT832(0) + auVar27,
                         (ulong)(ushort)((ushort)uVar16 | (ushort)((byte)uVar3 & 7)),auVar17);
LAB_00103c2a:
              std::__cxx11::stringstream::~stringstream((stringstream *)&outfile);
              std::ios_base::~ios_base(local_870);
            }
            else {
              std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
              point.v._0_8_ = local_8d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&point,"f","");
              uVar3 = point.v._0_8_;
              if (sStack_780 == CONCAT44(uStack_8dc,point.v[2])) {
                if (sStack_780 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar8 = bcmp(_outfile,(void *)point.v._0_8_,sStack_780);
                  bVar14 = iVar8 == 0;
                }
              }
              else {
                bVar14 = false;
              }
              if ((undefined1 *)uVar3 != local_8d8) {
                operator_delete((void *)uVar3,local_8d8._0_8_ + 1);
              }
              if (_outfile != &local_778) {
                operator_delete(_outfile,local_778 + 1);
              }
              if (bVar14) {
                std::__cxx11::stringstream::stringstream
                          ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
                piVar9 = std::operator>>((istream *)&outfile,(char *)&sizes);
                piVar9 = (istream *)std::istream::operator>>(piVar9,(int *)&outname);
                piVar9 = (istream *)std::istream::operator>>(piVar9,&v1);
                std::istream::operator>>(piVar9,&v2);
                point.v[0] = (float)((int)outname._M_dataplus._M_p + -1);
                point.v[1] = (float)(v1 + -1);
                point.v[2] = (float)(v2 + -1);
                if (faceList.
                    super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    faceList.
                    super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>>::
                  _M_realloc_insert<Vec<3u,unsigned_int>>
                            ((vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>> *)
                             &faceList,
                             (iterator)
                             faceList.
                             super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (Vec<3U,_unsigned_int> *)&point);
                }
                else {
                  (faceList.
                   super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->v[2] = (uint)point.v[2];
                  *(ulong *)(faceList.
                             super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->v =
                       CONCAT44(point.v[1],point.v[0]);
                  faceList.
                  super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       faceList.
                       super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                goto LAB_00103c2a;
              }
              std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
              point.v._0_8_ = local_8d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&point,"vn","");
              uVar3 = point.v._0_8_;
              if (sStack_780 == CONCAT44(uStack_8dc,point.v[2])) {
                if (sStack_780 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar8 = bcmp(_outfile,(void *)point.v._0_8_,sStack_780);
                  bVar14 = iVar8 == 0;
                }
              }
              else {
                bVar14 = false;
              }
              if ((undefined1 *)uVar3 != local_8d8) {
                operator_delete((void *)uVar3,local_8d8._0_8_ + 1);
              }
              if (_outfile != &local_778) {
                operator_delete(_outfile,local_778 + 1);
              }
              if (bVar14) {
                std::operator<<((ostream *)&std::cerr,
                                "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n"
                               );
                exit(-2);
              }
              local_878 = (ulong)((int)local_878 + 1);
            }
            lVar1 = _infile[-3];
          } while ((abStack_528[lVar1] & 2) == 0);
        }
        std::ifstream::close();
        iVar8 = (int)local_878;
        if (0 < iVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning: ",9);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," lines were ignored since they did not contain faces or vertices.\n",
                     0x42);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read in ",8);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," vertices and ",0xe);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," faces.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        auVar29._4_4_ = dx;
        auVar29._0_4_ = dx;
        auVar29._8_4_ = dx;
        auVar29._12_4_ = dx;
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        fVar2 = dx * (float)padding;
        uVar3 = vmovlps_avx(auVar30);
        uVar6 = sStack_780._4_4_;
        _outfile = (float)uVar3;
        fStack_784 = (float)((ulong)uVar3 >> 0x20);
        fStack_784 = fVar2 * fStack_784;
        _outfile = fVar2 * _outfile;
        sStack_780._0_4_ = fVar2 * 1.0;
        auVar20._12_4_ = 0;
        auVar20._0_12_ = _outfile;
        auVar21._0_12_ = local_8b8._0_12_;
        auVar21._12_4_ = 0;
        auVar26 = vsubps_avx(auVar21,auVar20);
        _local_8b8 = auVar26._0_12_;
        uVar3 = vmovlps_avx(auVar30);
        _outfile = (float)uVar3;
        fStack_784 = (float)((ulong)uVar3 >> 0x20);
        _outfile = fVar2 * _outfile;
        fStack_784 = fVar2 * fStack_784;
        local_888.v[0] = _outfile + local_888.v[0];
        local_888.v[1] = fStack_784 + local_888.v[1];
        local_888.v[2] = fVar2 * 1.0 + local_888.v[2];
        sStack_780._0_4_ = local_888.v[2];
        _outfile = local_888.v[0];
        fStack_784 = local_888.v[1];
        auVar22._12_4_ = 0;
        auVar22._0_12_ = (undefined1  [12])_local_8b8;
        auVar23._0_12_ = outfile._0_12_;
        auVar23._12_4_ = 0;
        auVar26 = vsubps_avx(auVar23,auVar22);
        auVar24._0_12_ = auVar26._0_12_;
        auVar24._12_4_ = 0;
        auVar26 = vdivps_avx(auVar24,auVar29);
        auVar25._0_12_ = auVar26._0_12_;
        _outfile = auVar25._0_12_;
        _outfile = CONCAT412(uVar6,_outfile);
        auVar25._12_4_ = 0;
        auVar26 = vcvttps2udq_avx512vl(auVar25);
        auVar26 = vmovdqu32_avx512vl(auVar26);
        sizes.v[0] = auVar26._0_4_;
        sizes.v[1] = auVar26._4_4_;
        sizes.v[2] = auVar26._8_4_;
        v2 = auVar26._12_4_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Bound box size: (",0x11);
        poVar10 = operator<<((ostream *)&std::cout,(Vec<3U,_float> *)local_8b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") to (",6);
        poVar10 = operator<<(poVar10,&local_888);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") with dimensions ",0x12);
        poVar10 = operator<<(poVar10,&sizes);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Computing signed distance field.\n",0x21);
        point.v[0] = 0.0;
        point.v[1] = 0.0;
        point.v[2] = 0.0;
        local_8d8 = (undefined1  [16])0x0;
        local_8c8 = (float *)0x0;
        make_level_set3(&faceList,&vertList,(Vec3f *)local_8b8,dx,sizes.v[0],sizes.v[1],sizes.v[2],
                        (Array3f *)&point,1);
        outname._M_dataplus._M_p = (pointer)&outname.field_2;
        outname._M_string_length = 0;
        outname.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::substr((ulong)&v1,(ulong)&filename);
        v2 = (int)local_7e8;
        uStack_7f4 = (undefined4)((ulong)local_7e8 >> 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)&v2,".sdf","");
        uVar16 = 0xf;
        if (_v1 != local_858) {
          uVar16 = local_858[0];
        }
        if (uVar16 < local_7f0 + local_860) {
          uVar16 = 0xf;
          if ((ulong *)CONCAT44(uStack_7f4,v2) != local_7e8) {
            uVar16 = local_7e8[0];
          }
          if (local_7f0 + local_860 <= uVar16) {
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&v2,0,(char *)0x0,(ulong)_v1);
            goto LAB_00104158;
          }
        }
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&v1,CONCAT44(uStack_7f4,v2))
        ;
LAB_00104158:
        _outfile = &local_778;
        plVar12 = puVar11 + 2;
        if ((long *)*puVar11 == plVar12) {
          local_778 = *plVar12;
          uStack_770 = puVar11[3];
        }
        else {
          local_778 = *plVar12;
          _outfile = (long *)*puVar11;
        }
        sStack_780 = puVar11[1];
        *puVar11 = plVar12;
        puVar11[1] = 0;
        *(undefined1 *)plVar12 = 0;
        std::__cxx11::string::operator=((string *)&outname,(string *)&outfile);
        if (_outfile != &local_778) {
          operator_delete(_outfile,local_778 + 1);
        }
        if ((ulong *)CONCAT44(uStack_7f4,v2) != local_7e8) {
          operator_delete((ulong *)CONCAT44(uStack_7f4,v2),local_7e8[0] + 1);
        }
        if (_v1 != local_858) {
          operator_delete(_v1,local_858[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Writing results to: ",0x14);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,outname._M_dataplus._M_p,outname._M_string_length
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        std::ofstream::ofstream(&outfile,outname._M_dataplus._M_p,_S_out);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&outfile,(int)point.v[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(int)point.v[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        plVar12 = (long *)std::ostream::operator<<((ostream *)poVar10,(int)point.v[2]);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
        poVar10 = std::ostream::_M_insert<double>((double)(float)local_8b8._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        poVar10 = std::ostream::_M_insert<double>((double)(float)local_8b8._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        poVar10 = std::ostream::_M_insert<double>((double)fStack_8b0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        poVar10 = std::ostream::_M_insert<double>((double)dx);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if (local_8d8._0_8_ != 0) {
          uVar16 = 0;
          uVar13 = 1;
          do {
            poVar10 = std::ostream::_M_insert<double>((double)local_8c8[uVar16]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            bVar14 = uVar13 < (ulong)local_8d8._0_8_;
            uVar16 = uVar13;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar14);
        }
        std::ofstream::close();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Processing complete.\n",0x15);
        _outfile = (long *)_VTT;
        *(undefined8 *)(&outfile + *(long *)(_VTT + -0x18)) = __filebuf;
        std::filebuf::~filebuf((filebuf *)&sStack_780);
        std::ios_base::~ios_base(local_690);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outname._M_dataplus._M_p != &outname.field_2) {
          operator_delete(outname._M_dataplus._M_p,
                          CONCAT71(outname.field_2._M_allocated_capacity._1_7_,
                                   outname.field_2._M_local_buf[0]) + 1);
        }
        point.v[0] = 0.0;
        point.v[1] = 0.0;
        free(local_8c8);
        if (faceList.
            super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(faceList.
                          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)faceList.
                                super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)faceList.
                                super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vertList.
                          super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vertList.
                                super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vertList.
                                super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p,
                          CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(&infile);
        std::__cxx11::stringstream::~stringstream((stringstream *)&arg3);
        std::ios_base::~ios_base(aiStack_2c0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&arg2);
        std::ios_base::~ios_base(aiStack_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        return 0;
      }
    }
    std::operator<<((ostream *)&std::cerr,
                    "Error: Expected OBJ file with filename of the form <name>.obj.\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\nThe output file format is:");
    std::operator<<((ostream *)&std::cout,"<ni> <nj> <nk>\n");
    std::operator<<((ostream *)&std::cout,"<origin_x> <origin_y> <origin_z>\n");
    std::operator<<((ostream *)&std::cout,"<dx>\n");
    std::operator<<((ostream *)&std::cout,"<value_1> <value_2> <value_3> [...]\n\n");
    std::operator<<((ostream *)&std::cout,
                    "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n");
    std::operator<<((ostream *)&std::cout,"<dx> is the grid spacing.\n\n");
    std::operator<<((ostream *)&std::cout,
                    "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"Usage: SDFGen <filename> <dx> <padding>\n\n");
    std::operator<<((ostream *)&std::cout,"Where:\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "\t<dx> specifies the length of grid cell in the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n"
                   );
  }
LAB_001046d1:
  exit(-1);
}

Assistant:

int main(int argc, char* argv[]) {
  
  if(argc != 4) {
    std::cout << "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n";
    std::cout << "\nThe output file format is:";
    std::cout << "<ni> <nj> <nk>\n";
    std::cout << "<origin_x> <origin_y> <origin_z>\n";
    std::cout << "<dx>\n";
    std::cout << "<value_1> <value_2> <value_3> [...]\n\n";
    
    std::cout << "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n";
    std::cout << "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n";
    std::cout << "<dx> is the grid spacing.\n\n";
    std::cout << "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n";

    std::cout << "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n";

    std::cout << "Usage: SDFGen <filename> <dx> <padding>\n\n";
    std::cout << "Where:\n";
    std::cout << "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n";
    std::cout << "\t<dx> specifies the length of grid cell in the resulting distance field.\n";
    std::cout << "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n";
    
    exit(-1);
  }

  std::string filename(argv[1]);
  if(filename.size() < 5 || filename.substr(filename.size()-4) != std::string(".obj")) {
    std::cerr << "Error: Expected OBJ file with filename of the form <name>.obj.\n";
    exit(-1);
  }

  std::stringstream arg2(argv[2]);
  float dx;
  arg2 >> dx;
  
  std::stringstream arg3(argv[3]);
  int padding;
  arg3 >> padding;

  if(padding < 1) padding = 1;
  //start with a massive inside out bound box.
  Vec3f min_box(std::numeric_limits<float>::max(),std::numeric_limits<float>::max(),std::numeric_limits<float>::max()), 
    max_box(-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max());
  
  std::cout << "Reading data.\n";

  std::ifstream infile(argv[1]);
  if(!infile) {
    std::cerr << "Failed to open. Terminating.\n";
    exit(-1);
  }

  int ignored_lines = 0;
  std::string line;
  std::vector<Vec3f> vertList;
  std::vector<Vec3ui> faceList;
  while(!infile.eof()) {
    std::getline(infile, line);

    //.obj files sometimes contain vertex normals indicated by "vn"
    if(line.substr(0,1) == std::string("v") && line.substr(0,2) != std::string("vn")){
      std::stringstream data(line);
      char c;
      Vec3f point;
      data >> c >> point[0] >> point[1] >> point[2];
      vertList.push_back(point);
      update_minmax(point, min_box, max_box);
    }
    else if(line.substr(0,1) == std::string("f")) {
      std::stringstream data(line);
      char c;
      int v0,v1,v2;
      data >> c >> v0 >> v1 >> v2;
      faceList.push_back(Vec3ui(v0-1,v1-1,v2-1));
    }
    else if( line.substr(0,2) == std::string("vn") ){
      std::cerr << "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n";
      exit(-2); 
    }
    else {
      ++ignored_lines; 
    }
  }
  infile.close();
  
  if(ignored_lines > 0)
    std::cout << "Warning: " << ignored_lines << " lines were ignored since they did not contain faces or vertices.\n";

  std::cout << "Read in " << vertList.size() << " vertices and " << faceList.size() << " faces." << std::endl;

  //Add padding around the box.
  Vec3f unit(1,1,1);
  min_box -= padding*dx*unit;
  max_box += padding*dx*unit;
  Vec3ui sizes = Vec3ui((max_box - min_box)/dx);
  
  std::cout << "Bound box size: (" << min_box << ") to (" << max_box << ") with dimensions " << sizes << "." << std::endl;

  std::cout << "Computing signed distance field.\n";
  Array3f phi_grid;
  make_level_set3(faceList, vertList, min_box, dx, sizes[0], sizes[1], sizes[2], phi_grid);

  std::string outname;

  #ifdef HAVE_VTK
    // If compiled with VTK, we can directly output a volumetric image format instead
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".vti");
    std::cout << "Writing results to: " << outname << "\n";
    vtkSmartPointer<vtkImageData> output_volume = vtkSmartPointer<vtkImageData>::New();

    output_volume->SetDimensions(phi_grid.ni ,phi_grid.nj ,phi_grid.nk);
    output_volume->SetOrigin( phi_grid.ni*dx/2, phi_grid.nj*dx/2,phi_grid.nk*dx/2);
    output_volume->SetSpacing(dx,dx,dx);

    vtkSmartPointer<vtkFloatArray> distance = vtkSmartPointer<vtkFloatArray>::New();
    
    distance->SetNumberOfTuples(phi_grid.a.size());
    
    output_volume->GetPointData()->AddArray(distance);
    distance->SetName("Distance");

    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      distance->SetValue(i, phi_grid.a[i]);
    }

    vtkSmartPointer<vtkXMLImageDataWriter> writer =
    vtkSmartPointer<vtkXMLImageDataWriter>::New();
    writer->SetFileName(outname.c_str());

    #if VTK_MAJOR_VERSION <= 5
      writer->SetInput(output_volume);
    #else
      writer->SetInputData(output_volume);
    #endif
    writer->Write();

  #else
    // if VTK support is missing, default back to the original ascii file-dump.
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".sdf");
    std::cout << "Writing results to: " << outname << "\n";
    
    std::ofstream outfile( outname.c_str());
    outfile << phi_grid.ni << " " << phi_grid.nj << " " << phi_grid.nk << std::endl;
    outfile << min_box[0] << " " << min_box[1] << " " << min_box[2] << std::endl;
    outfile << dx << std::endl;
    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      outfile << phi_grid.a[i] << std::endl;
    }
    outfile.close();
  #endif

  std::cout << "Processing complete.\n";

return 0;
}